

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mousenu.c
# Opt level: O0

int al_get_mouse_state_axis(ALLEGRO_MOUSE_STATE *state,int axis)

{
  int axis_local;
  ALLEGRO_MOUSE_STATE *state_local;
  int local_4;
  
  switch(axis) {
  case 0:
    local_4 = state->x;
    break;
  case 1:
    local_4 = state->y;
    break;
  case 2:
    local_4 = state->z;
    break;
  case 3:
    local_4 = state->w;
    break;
  default:
    local_4 = state->more_axes[axis + -4];
  }
  return local_4;
}

Assistant:

int al_get_mouse_state_axis(const ALLEGRO_MOUSE_STATE *state, int axis)
{
   ASSERT(state);
   ASSERT(axis >= 0);
   ASSERT(axis < (4 + ALLEGRO_MOUSE_MAX_EXTRA_AXES));

   switch (axis) {
      case 0:
         return state->x;
      case 1:
         return state->y;
      case 2:
         return state->z;
      case 3:
         return state->w;
      default:
         return state->more_axes[axis - 4];
   }
}